

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O0

void printAddrMode3Operand(MCInst *MI,uint Op,SStream *O,_Bool AlwaysPrintImm0)

{
  _Bool _Var1;
  MCOperand *op;
  uint in_ESI;
  MCInst *in_RDI;
  MCOperand *MO1;
  undefined3 in_stack_0000000c;
  _Bool in_stack_0000002f;
  SStream *in_stack_00000030;
  uint in_stack_0000003c;
  MCInst *in_stack_00000040;
  
  op = MCInst_getOperand(in_RDI,in_ESI);
  _Var1 = MCOperand_isReg(op);
  if (_Var1) {
    printAM3PreOrOffsetIndexOp
              (in_stack_00000040,in_stack_0000003c,in_stack_00000030,in_stack_0000002f);
  }
  else {
    printOperand((MCInst *)O,_in_stack_0000000c,(SStream *)MO1);
  }
  return;
}

Assistant:

static void printAddrMode3Operand(MCInst *MI, unsigned Op, SStream *O,
		bool AlwaysPrintImm0)
{
	MCOperand *MO1 = MCInst_getOperand(MI, Op);
	if (!MCOperand_isReg(MO1)) {   //  For label symbolic references.
		printOperand(MI, Op, O);
		return;
	}

	printAM3PreOrOffsetIndexOp(MI, Op, O, AlwaysPrintImm0);
}